

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

bool tcu::intThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,UVec4 *threshold,CompareLogMode logMode)

{
  ostringstream *poVar1;
  TestLog *this;
  bool bVar2;
  uint uVar3;
  TextureChannelClass TVar4;
  InternalError *this_00;
  uint uVar5;
  Vec4 *bias;
  ConstPixelBufferAccess *pCVar6;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  int iVar7;
  string *this_01;
  int iVar8;
  int z;
  int iVar9;
  allocator<char> local_4e8;
  allocator<char> local_4e7;
  allocator<char> local_4e6;
  allocator<char> local_4e5;
  allocator<char> local_4e4;
  allocator<char> local_4e3;
  allocator<char> local_4e2;
  allocator<char> local_4e1;
  int local_4e0;
  int local_4dc;
  ConstPixelBufferAccess *local_4d8;
  UVec4 *local_4d0;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  Vec4 local_4b8;
  Vec4 local_4a8;
  char *local_490;
  char *local_488;
  ConstPixelBufferAccess *local_480;
  Vector<unsigned_int,_4> local_478;
  string local_468;
  TestLog *local_448;
  string local_440;
  LogImageSet local_420;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  UVec4 diff;
  IVec4 cmpPix;
  IVec4 refPix;
  
  iVar9 = (reference->m_size).m_data[0];
  iVar8 = (reference->m_size).m_data[1];
  iVar7 = (reference->m_size).m_data[2];
  refPix.m_data[0] = 7;
  refPix.m_data[1] = 3;
  local_4d8 = reference;
  local_4d0 = threshold;
  local_490 = imageSetDesc;
  local_488 = imageSetName;
  TextureLevel::TextureLevel(&errorMaskStorage,(TextureFormat *)&refPix,iVar9,iVar8,iVar7);
  TextureLevel::getAccess(&errorMask,&errorMaskStorage);
  local_478.m_data[0] = 0;
  local_478.m_data[1] = 0;
  local_478.m_data[2] = 0;
  local_478.m_data[3] = 0;
  local_4a8.m_data[0] = 0.0;
  local_4a8.m_data[1] = 0.0;
  local_4a8.m_data[2] = 0.0;
  local_4a8.m_data[3] = 0.0;
  local_4b8.m_data[0] = 1.0;
  local_4b8.m_data[1] = 1.0;
  local_4b8.m_data[2] = 1.0;
  local_4b8.m_data[3] = 1.0;
  local_448 = log;
  if ((((result->m_size).m_data[0] != iVar9) || ((result->m_size).m_data[1] != iVar8)) ||
     ((result->m_size).m_data[2] != iVar7)) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this_00,(char *)0x0,
               "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,0x2f2);
    __cxa_throw(this_00,&InternalError::typeinfo,Exception::~Exception);
  }
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  local_4e0 = iVar9;
  local_4c4 = iVar7;
  local_4c0 = iVar8;
  local_480 = result;
  for (z = 0; z != local_4c4; z = z + 1) {
    iVar9 = 0;
    while (iVar9 != local_4c0) {
      iVar7 = 0;
      iVar8 = local_4e0;
      local_4dc = iVar9;
      while( true ) {
        iVar9 = local_4dc;
        if (iVar8 == iVar7) break;
        ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)&refPix,(int)local_4d8,iVar7,local_4dc);
        local_4bc = iVar7;
        ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)&cmpPix,(int)local_480,iVar7,iVar9);
        operator-((tcu *)&local_468,&refPix,(Vector<int,_4> *)&cmpPix);
        abs<int,4>((tcu *)&local_420,(Vector<int,_4> *)&local_468);
        Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&diff);
        lessThanEqual<unsigned_int,4>((tcu *)&local_420,&diff,local_4d0);
        iVar8 = local_4e0;
        bVar2 = boolAll<4>((Vector<bool,_4> *)&local_420);
        max<unsigned_int,4>((tcu *)&local_420,&local_478,&diff);
        iVar7 = local_4bc;
        uVar5 = 0;
        uVar3 = 0xff;
        if (bVar2) {
          uVar3 = 0;
        }
        local_478.m_data[1] = local_420.m_name._M_dataplus._M_p._4_4_;
        local_478.m_data[0] = (uint)local_420.m_name._M_dataplus._M_p;
        if (bVar2) {
          uVar5 = 0xff;
        }
        local_478.m_data[2] = (undefined4)local_420.m_name._M_string_length;
        local_478.m_data[3] = local_420.m_name._M_string_length._4_4_;
        local_420.m_name._M_string_length = 0xff00000000;
        local_420.m_name._M_dataplus._M_p._0_4_ = uVar3;
        local_420.m_name._M_dataplus._M_p._4_4_ = uVar5;
        PixelBufferAccess::setPixel(&errorMask,(IVec4 *)&local_420,local_4bc,local_4dc,z);
        iVar7 = iVar7 + 1;
      }
      iVar9 = local_4dc + 1;
    }
  }
  lessThanEqual<unsigned_int,4>((tcu *)&refPix,&local_478,local_4d0);
  bVar2 = boolAll<4>((Vector<bool,_4> *)&refPix);
  this = local_448;
  pCVar6 = local_480;
  bias = (Vec4 *)(ulong)logMode;
  iVar9 = (int)local_448;
  if (logMode == COMPARE_LOG_EVERYTHING || !bVar2) {
    TVar4 = getTextureChannelClass((local_4d8->m_format).type);
    if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      TVar4 = getTextureChannelClass((pCVar6->m_format).type);
      if (TVar4 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) goto LAB_001e76f3;
    }
    else {
LAB_001e76f3:
      bias = &local_4a8;
      anon_unknown_50::computeScaleAndBias(local_4d8,pCVar6,&local_4b8,bias);
      poVar1 = (ostringstream *)(refPix.m_data + 2);
      refPix.m_data._0_8_ = this;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Result and reference images are normalized with formula p * ");
      operator<<((ostream *)poVar1,&local_4b8);
      std::operator<<((ostream *)poVar1," + ");
      operator<<((ostream *)poVar1,&local_4a8);
      MessageBuilder::operator<<((MessageBuilder *)&refPix,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    if (!bVar2) {
      poVar1 = (ostringstream *)(refPix.m_data + 2);
      refPix.m_data._0_8_ = this;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Image comparison failed: max difference = ");
      operator<<((ostream *)poVar1,&local_478);
      std::operator<<((ostream *)poVar1,", threshold = ");
      operator<<((ostream *)poVar1,local_4d0);
      MessageBuilder::operator<<((MessageBuilder *)&refPix,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,local_488,&local_4e1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,local_490,&local_4e2);
    LogImageSet::LogImageSet(&local_420,&local_468,&local_440);
    LogImageSet::write(&local_420,iVar9,__buf_01,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"Result",&local_4e3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"Result",&local_4e4);
    LogImage::LogImage((LogImage *)&refPix,&local_380,&local_3a0,pCVar6,&local_4b8,&local_4a8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&refPix,iVar9,__buf_02,(size_t)pCVar6);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"Reference",&local_4e5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"Reference",&local_4e6);
    pCVar6 = local_4d8;
    LogImage::LogImage((LogImage *)&cmpPix,&local_3c0,&local_3e0,local_4d8,&local_4b8,&local_4a8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&cmpPix,iVar9,__buf_03,(size_t)pCVar6);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"ErrorMask",&local_4e7);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Error mask",&local_4e8)
    ;
    pCVar6 = &errorMask.super_ConstPixelBufferAccess;
    LogImage::LogImage((LogImage *)&diff,&local_340,&local_360,pCVar6,QP_IMAGE_COMPRESSION_MODE_BEST
                      );
    LogImage::write((LogImage *)&diff,iVar9,__buf_04,(size_t)pCVar6);
    TestLog::endImageSet(this);
    LogImage::~LogImage((LogImage *)&diff);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    LogImage::~LogImage((LogImage *)&cmpPix);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
    LogImage::~LogImage((LogImage *)&refPix);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    LogImageSet::~LogImageSet(&local_420);
    std::__cxx11::string::~string((string *)&local_440);
    this_01 = &local_468;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_001e7a34;
    if (((local_480->m_format).order != RGBA) || ((local_480->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(local_480,&local_4b8,&local_4a8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&diff,local_488,(allocator<char> *)&local_380);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,local_490,(allocator<char> *)&local_3a0);
    LogImageSet::LogImageSet((LogImageSet *)&cmpPix,(string *)&diff,&local_420.m_name);
    LogImageSet::write((LogImageSet *)&cmpPix,iVar9,__buf,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"Result",(allocator<char> *)&local_3c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"Result",(allocator<char> *)&local_3e0);
    LogImage::LogImage((LogImage *)&refPix,&local_468,&local_440,pCVar6,&local_4b8,&local_4a8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&refPix,iVar9,__buf_00,(size_t)pCVar6);
    TestLog::endImageSet(this);
    LogImage::~LogImage((LogImage *)&refPix);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_468);
    LogImageSet::~LogImageSet((LogImageSet *)&cmpPix);
    std::__cxx11::string::~string((string *)&local_420);
    this_01 = (string *)&diff;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_001e7a34:
  TextureLevel::~TextureLevel(&errorMaskStorage);
  return bVar2;
}

Assistant:

bool intThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, CompareLogMode logMode)
{
	int					width				= reference.getWidth();
	int					height				= reference.getHeight();
	int					depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	UVec4				maxDiff				(0, 0, 0, 0);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	TCU_CHECK_INTERNAL(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				IVec4	refPix		= reference.getPixelInt(x, y, z);
				IVec4	cmpPix		= result.getPixelInt(x, y, z);

				UVec4	diff		= abs(refPix - cmpPix).cast<deUint32>();
				bool	isOk		= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? IVec4(0, 0xff, 0, 0xff) : IVec4(0xff, 0, 0, 0xff), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}